

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

int Abc_NtkBmSat(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Vec_Ptr_t *iMatchPairs,Vec_Ptr_t *oMatchPairs,
                Vec_Int_t *mismatch,int mode)

{
  Vec_Ptr_t *vPairs;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pMiter;
  int *pModel;
  Abc_Ntk_t *pNtk;
  char *__format;
  int iVar2;
  
  if (mode == 0) {
    pMiter = Abc_NtkMiterBm(pNtk1,pNtk2,iMatchPairs,oMatchPairs);
    if (pMiter != (Abc_Ntk_t *)0x0) {
      iVar2 = Abc_NtkMiterIsConstant(pMiter);
      if (iVar2 == 1) {
        Abc_NtkDelete(pMiter);
        return 1;
      }
      if (iVar2 == 0) {
        if (mismatch != (Vec_Int_t *)0x0) {
          pModel = Abc_NtkVerifyGetCleanModel(pMiter,1);
          pMiter->pModel = pModel;
          Abc_NtkVerifyReportError(pNtk1,pNtk2,pModel,mismatch);
          if (pMiter->pModel != (int *)0x0) {
            free(pMiter->pModel);
            pMiter->pModel = (int *)0x0;
          }
        }
        Abc_NtkDelete(pMiter);
        return 0;
      }
      pNtk = Abc_NtkMulti(pMiter,0,100,1,0,0,0);
      Abc_NtkDelete(pMiter);
      if (pNtk != (Abc_Ntk_t *)0x0) {
        iVar2 = Abc_NtkMiterSat(pNtk,10000,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
        if ((mismatch != (Vec_Int_t *)0x0) && (pNtk->pModel != (int *)0x0)) {
          Abc_NtkVerifyReportError(pNtk1,pNtk2,pNtk->pModel,mismatch);
        }
        if (pNtk->pModel != (int *)0x0) {
          free(pNtk->pModel);
          pNtk->pModel = (int *)0x0;
        }
        Abc_NtkDelete(pNtk);
        return iVar2;
      }
      __format = "Renoding for CNF has failed.";
      goto LAB_00223543;
    }
  }
  else if (mode == 1) {
    vPairs = Vec_PtrAlloc(100);
    for (iVar2 = 0; iVar2 < *(int *)(_DAT_00000040 + 4); iVar2 = iVar2 + 1) {
      pAVar1 = Abc_NtkCo((Abc_Ntk_t *)0x0,iVar2);
      Abc_ObjRemoveFanins(pAVar1);
    }
    for (iVar2 = 0; iVar2 < oMatchPairs->nSize; iVar2 = iVar2 + 2) {
      pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(oMatchPairs,iVar2);
      pAVar1 = Abc_ObjChild0Copy(pAVar1);
      Vec_PtrPush(vPairs,pAVar1);
      pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(oMatchPairs,iVar2 + 1);
      pAVar1 = Abc_ObjChild0Copy(pAVar1);
      Vec_PtrPush(vPairs,pAVar1);
    }
    pAVar1 = Abc_AigMiter(_DAT_00000100,vPairs,0);
    pObj = Abc_NtkPo((Abc_Ntk_t *)0x0,0);
    Abc_ObjAddFanin(pObj,pAVar1);
    Vec_PtrFree(vPairs);
  }
  __format = "Miter computation has failed.";
LAB_00223543:
  printf(__format);
  return -1;
}

Assistant:

int Abc_NtkBmSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Vec_Ptr_t * iMatchPairs, Vec_Ptr_t * oMatchPairs, Vec_Int_t * mismatch, int mode)
{    
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );	

	Abc_Ntk_t * pMiter = NULL;
    Abc_Ntk_t * pCnf;
    int RetValue;

	// get the miter of the two networks
	if( mode == 0 )
	{
		//Abc_NtkDelete( pMiter );
		pMiter = Abc_NtkMiterBm( pNtk1, pNtk2, iMatchPairs, oMatchPairs );
	}
	else if( mode == 1 )		// add new outputs
	{		
		int i;
		Abc_Obj_t * pObj;
		Vec_Ptr_t * vPairs;
		Abc_Obj_t * pNtkMiter;		

		vPairs = Vec_PtrAlloc( 100 );

		Abc_NtkForEachCo( pMiter, pObj, i )			
			Abc_ObjRemoveFanins( pObj );

		for(i = 0; i < Vec_PtrSize( oMatchPairs ); i += 2)
		{
			Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oMatchPairs, i)) );
			Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oMatchPairs, i+1)) );
		}
		pNtkMiter = Abc_AigMiter( (Abc_Aig_t *)pMiter->pManFunc, vPairs, 0 );
		Abc_ObjAddFanin( Abc_NtkPo(pMiter,0), pNtkMiter );	 
		Vec_PtrFree( vPairs);
	}
	else if( mode == 2 )		// add some outputs
	{

	}
	else if( mode == 3)			// remove all outputs
	{
	}

	if ( pMiter == NULL )
	{
		printf("Miter computation has failed.");		
		return -1;
	}
	RetValue = Abc_NtkMiterIsConstant( pMiter );
	if ( RetValue == 0)
	{		
		/*printf("Networks are NOT EQUIVALENT after structural hashing.");	*/
		// report the error    	
		if(mismatch != NULL)
		{
			pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
			Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel, mismatch );
			ABC_FREE( pMiter->pModel );
		}        
		Abc_NtkDelete( pMiter );
        return RetValue;
	}
	if( RetValue == 1 )
	{		
		/*printf("Networks are equivalent after structural hashing.");	*/
		Abc_NtkDelete( pMiter );
		return RetValue;
	}

	// convert the miter into a CNF
	//if(mode == 0)
	pCnf = Abc_NtkMulti( pMiter, 0, 100, 1, 0, 0, 0 );
    Abc_NtkDelete( pMiter );
    if ( pCnf == NULL )
    {        
		printf("Renoding for CNF has failed.");	
        return -1;
    }

    // solve the CNF using the SAT solver
    RetValue = Abc_NtkMiterSat( pCnf, (ABC_INT64_T)10000, (ABC_INT64_T)0, 0, NULL, NULL);
    /*if ( RetValue == -1 )
		printf("Networks are undecided (SAT solver timed out).");	
    else if ( RetValue == 0 )        
		printf("Networks are NOT EQUIVALENT after SAT.");	
    else
		printf("Networks are equivalent after SAT.");	*/
	if ( mismatch != NULL && pCnf->pModel )
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pCnf->pModel, mismatch );

    ABC_FREE( pCnf->pModel );
    Abc_NtkDelete( pCnf );

	return RetValue;
}